

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionData *
anon_unknown.dwarf_8df1c::ImplementPrototype(ExpressionContext *ctx,FunctionData *function)

{
  FunctionData *pFVar1;
  uint hash;
  bool_type bVar2;
  ScopeData *local_70;
  FunctionData *prototype;
  FunctionData *option;
  NodeIterator curr;
  ScopeData *lookupScope;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  
  if ((ctx->scope->type == SCOPE_TYPE) || (ctx->scope->type == SCOPE_NAMESPACE)) {
    local_70 = ctx->globalScope;
  }
  else {
    local_70 = ctx->scope;
  }
  curr.node = (Node *)local_70;
  hash = InplaceStr::hash(&function->name->name);
  _option = DirectChainedMap<IdentifierLookupResult>::first(&local_70->idLookupMap,hash);
  bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer((NodeIterator *)&option)
  ;
  if (bVar2 != 0) {
    while (bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                             ((NodeIterator *)&option), bVar2 != 0) {
      pFVar1 = *(FunctionData **)(curr.start + 0x10);
      if ((((pFVar1 != (FunctionData *)0x0) && (pFVar1 != function)) &&
          ((pFVar1->isPrototype & 1U) != 0)) && (pFVar1->type == function->type)) break;
      _option = DirectChainedMap<IdentifierLookupResult>::next(&ctx->scope->idLookupMap,_option);
    }
    bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                      ((NodeIterator *)&option);
    if (bVar2 != 0) {
      pFVar1 = *(FunctionData **)(curr.start + 0x10);
      pFVar1->implementation = function;
      ExpressionContext::HideFunction(ctx,pFVar1);
      return pFVar1;
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ImplementPrototype(ExpressionContext &ctx, FunctionData *function)
	{
		ScopeData *lookupScope = ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE ? ctx.globalScope : ctx.scope;

		if(DirectChainedMap<IdentifierLookupResult>::NodeIterator curr = lookupScope->idLookupMap.first(function->name->name.hash()))
		{
			while(curr)
			{
				FunctionData *option = curr.node->value.function;

				if(option && option != function && option->isPrototype && option->type == function->type)
					break;

				curr = ctx.scope->idLookupMap.next(curr);
			}

			if(curr)
			{
				FunctionData *prototype = curr.node->value.function;

				prototype->implementation = function;

				ctx.HideFunction(prototype);

				return prototype;
			}
		}

		return NULL;
	}